

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_metadata_info.cpp
# Opt level: O2

void duckdb::PragmaMetadataInfoFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  _func_int **__n;
  unsigned_long *puVar1;
  FunctionData *pFVar2;
  GlobalTableFunctionState *pGVar3;
  const_reference pvVar4;
  long lVar5;
  ulong index;
  unsigned_long *puVar6;
  vector<duckdb::Value,_true> list_values;
  pointer local_a8;
  pointer pVStack_a0;
  pointer local_98;
  Value local_88;
  LogicalType local_48;
  
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  index = 0;
  while( true ) {
    __n = pGVar3[1]._vptr_GlobalTableFunctionState;
    if (((_func_int **)
         (((long)pFVar2[5]._vptr_FunctionData - (long)pFVar2[4]._vptr_FunctionData) / 0x28) <= __n)
       || (0x7ff < index)) break;
    pGVar3[1]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
    pvVar4 = vector<duckdb::MetadataBlockInfo,_true>::get<true>
                       ((vector<duckdb::MetadataBlockInfo,_true> *)(pFVar2 + 4),(size_type)__n);
    Value::BIGINT(&local_88,pvVar4->block_id);
    DataChunk::SetValue(output,0,index,&local_88);
    Value::~Value(&local_88);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar4->total_blocks);
    Value::BIGINT(&local_88,lVar5);
    DataChunk::SetValue(output,1,index,&local_88);
    Value::~Value(&local_88);
    lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      ((long)(pvVar4->free_list).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar4->free_list).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    Value::BIGINT(&local_88,lVar5);
    DataChunk::SetValue(output,2,index,&local_88);
    Value::~Value(&local_88);
    list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar1 = (pvVar4->free_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar6 = (pvVar4->free_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
      lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(*puVar6);
      Value::BIGINT(&local_88,lVar5);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&list_values,&local_88);
      Value::~Value(&local_88);
    }
    LogicalType::LogicalType(&local_48,BIGINT);
    local_a8 = list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
    pVStack_a0 = list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_98 = list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    list_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::LIST(&local_88,&local_48,(vector<duckdb::Value,_true> *)&local_a8);
    DataChunk::SetValue(output,3,index,&local_88);
    Value::~Value(&local_88);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
    LogicalType::~LogicalType(&local_48);
    index = index + 1;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&list_values);
  }
  output->count = index;
  return;
}

Assistant:

static void PragmaMetadataInfoFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<PragmaMetadataFunctionData>();
	auto &data = data_p.global_state->Cast<PragmaMetadataOperatorData>();
	idx_t count = 0;
	while (data.offset < bind_data.metadata_info.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = bind_data.metadata_info[data.offset++];

		idx_t col_idx = 0;
		// block_id
		output.SetValue(col_idx++, count, Value::BIGINT(entry.block_id));
		// total_blocks
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.total_blocks)));
		// free_blocks
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.free_list.size())));
		// free_list
		vector<Value> list_values;
		for (auto &free_id : entry.free_list) {
			list_values.push_back(Value::BIGINT(NumericCast<int64_t>(free_id)));
		}
		output.SetValue(col_idx++, count, Value::LIST(LogicalType::BIGINT, std::move(list_values)));
		count++;
	}
	output.SetCardinality(count);
}